

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void remove_region(int merge,REGIONS *regions,int *num_regions,int *next_region)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  int num_merge;
  int k;
  undefined4 local_24;
  undefined4 local_4;
  
  iVar1 = *in_RCX;
  if (*in_RDX == 1) {
    *in_RDX = 0;
  }
  else {
    if (iVar1 == 0) {
      local_4 = 1;
    }
    else {
      local_4 = in_EDI;
      if (iVar1 == *in_RDX + -1) {
        local_4 = 0;
      }
    }
    iVar2 = (local_4 == 2) + 1;
    if (local_4 == 0) {
      *(undefined4 *)(in_RSI + (long)(iVar1 + -1) * 0x38 + 4) =
           *(undefined4 *)(in_RSI + (long)iVar1 * 0x38 + 4);
      *in_RCX = iVar1;
    }
    else if (local_4 == 1) {
      *(undefined4 *)(in_RSI + (long)(iVar1 + 1) * 0x38) =
           *(undefined4 *)(in_RSI + (long)iVar1 * 0x38);
      *in_RCX = iVar1 + 1;
    }
    else if (local_4 == 2) {
      *(undefined4 *)(in_RSI + (long)(iVar1 + -1) * 0x38 + 4) =
           *(undefined4 *)(in_RSI + (long)(iVar1 + 1) * 0x38 + 4);
      *in_RCX = iVar1;
    }
    *in_RDX = *in_RDX - iVar2;
    for (local_24 = *in_RCX - (uint)(local_4 == 1); local_24 < *in_RDX; local_24 = local_24 + 1) {
      memcpy((void *)(in_RSI + (long)local_24 * 0x38),
             (void *)(in_RSI + (long)(local_24 + iVar2) * 0x38),0x38);
    }
  }
  return;
}

Assistant:

static void remove_region(int merge, REGIONS *regions, int *num_regions,
                          int *next_region) {
  int k = *next_region;
  assert(k < *num_regions);
  if (*num_regions == 1) {
    *num_regions = 0;
    return;
  }
  if (k == 0) {
    merge = 1;
  } else if (k == *num_regions - 1) {
    merge = 0;
  }
  int num_merge = (merge == 2) ? 2 : 1;
  switch (merge) {
    case 0:
      regions[k - 1].last = regions[k].last;
      *next_region = k;
      break;
    case 1:
      regions[k + 1].start = regions[k].start;
      *next_region = k + 1;
      break;
    case 2:
      regions[k - 1].last = regions[k + 1].last;
      *next_region = k;
      break;
    default: assert(0);
  }
  *num_regions -= num_merge;
  for (k = *next_region - (merge == 1); k < *num_regions; k++) {
    regions[k] = regions[k + num_merge];
  }
}